

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall t_markdown_generator::generate_program(t_markdown_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  long lVar4;
  t_program *ptVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  pointer pptVar6;
  pointer pptVar7;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  string fname;
  string pname;
  _Vector_base<t_const_*,_std::allocator<t_const_*>_> local_68;
  string local_50;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&pname,this);
  iVar1 = mkdir(pname._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&pname);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(&consts,this);
      std::__cxx11::string::string
                ((string *)&fname,
                 (char *)consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                         super__Vector_impl_data._M_start,(allocator *)&services);
      std::operator+(&pname,&fname,": ");
      __rhs = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&pname,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::string
            ((string *)&pname,(string *)&((this->super_t_generator).program_)->name_);
  std::__cxx11::string::string((string *)&local_50,(string *)&pname);
  make_file_name(&fname,this,&local_50);
  std::__cxx11::string::operator=((string *)&this->current_file_,(string *)&fname);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&local_50);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&consts,this);
  std::operator+(&fname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&consts
                 ,&this->current_file_);
  std::__cxx11::string::~string((string *)&consts);
  std::__cxx11::string::string((string *)&consts,fname._M_dataplus._M_p,(allocator *)&services);
  this_00 = &this->f_out_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&consts,__oflag);
  std::__cxx11::string::~string((string *)&consts);
  poVar3 = std::operator<<((ostream *)this_00,"# Thrift module: ");
  poVar3 = std::operator<<(poVar3,(string *)&pname);
  poVar3 = std::operator<<(poVar3,'\n');
  std::operator<<(poVar3,'\n');
  print_doc(this,&((this->super_t_generator).program_)->super_t_doc);
  poVar3 = std::operator<<((ostream *)this_00,'\n');
  std::operator<<(poVar3,'\n');
  generate_program_toc(this);
  ptVar5 = (this->super_t_generator).program_;
  if ((ptVar5->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"***");
    poVar3 = std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(poVar3,"## Constants");
    poVar3 = std::operator<<(poVar3,'\n');
    std::operator<<(poVar3,'\n');
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              (&consts,&((this->super_t_generator).program_)->consts_);
    poVar3 = std::operator<<((ostream *)this_00,"|Constant|Type|Value||");
    poVar3 = std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(poVar3,"|---|---|---|---|");
    std::operator<<(poVar3,'\n');
    std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
              ((vector<t_const_*,_std::allocator<t_const_*>_> *)&local_68,&consts);
    (*(this->super_t_generator)._vptr_t_generator[0x11])(this,&local_68);
    std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base(&local_68);
    std::operator<<((ostream *)this_00,'\n');
    std::_Vector_base<t_const_*,_std::allocator<t_const_*>_>::~_Vector_base
              (&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"***");
    poVar3 = std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(poVar3,"## Enumerations");
    poVar3 = std::operator<<(poVar3,'\n');
    std::operator<<(poVar3,'\n');
    std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
              ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&consts,
               &((this->super_t_generator).program_)->enums_);
    for (pptVar7 = consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar7 !=
        consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x13])(this,*pptVar7);
    }
    std::_Vector_base<t_enum_*,_std::allocator<t_enum_*>_>::~_Vector_base
              ((_Vector_base<t_enum_*,_std::allocator<t_enum_*>_> *)&consts);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"***");
    poVar3 = std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(poVar3,"## Type declarations");
    poVar3 = std::operator<<(poVar3,'\n');
    std::operator<<(poVar3,'\n');
    std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
              ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&consts,
               &((this->super_t_generator).program_)->typedefs_);
    for (pptVar7 = consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar7 !=
        consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x12])(this,*pptVar7);
    }
    std::_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>::~_Vector_base
              ((_Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_> *)&consts);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"***");
    poVar3 = std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(poVar3,"## Data structures");
    poVar3 = std::operator<<(poVar3,'\n');
    std::operator<<(poVar3,'\n');
    std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
              ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&consts,
               &((this->super_t_generator).program_)->objects_);
    for (pptVar7 = consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar7 !=
        consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
      iVar1 = (*((*pptVar7)->super_t_doc)._vptr_t_doc[0xc])();
      lVar4 = 0xa8;
      if ((char)iVar1 != '\0') {
        lVar4 = 0xc0;
      }
      (**(code **)((long)(this->super_t_generator)._vptr_t_generator + lVar4))(this,*pptVar7);
    }
    std::_Vector_base<t_struct_*,_std::allocator<t_struct_*>_>::~_Vector_base
              ((_Vector_base<t_struct_*,_std::allocator<t_struct_*>_> *)&consts);
    ptVar5 = (this->super_t_generator).program_;
  }
  if ((ptVar5->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar5->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<((ostream *)this_00,"***");
    poVar3 = std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<(poVar3,"## Services");
    poVar3 = std::operator<<(poVar3,'\n');
    std::operator<<(poVar3,'\n');
    std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
              (&services,&((this->super_t_generator).program_)->services_);
    for (pptVar6 = services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar6 !=
        services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      (*(this->super_t_generator)._vptr_t_generator[0x1a])((string *)&consts,this,*pptVar6);
      std::__cxx11::string::operator=
                ((string *)&(this->super_t_generator).service_name_,(string *)&consts);
      std::__cxx11::string::~string((string *)&consts);
      (*(this->super_t_generator)._vptr_t_generator[0x16])(this,*pptVar6);
    }
    std::_Vector_base<t_service_*,_std::allocator<t_service_*>_>::~_Vector_base
              (&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>);
  }
  iVar1 = 10;
  std::operator<<((ostream *)this_00,'\n');
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,iVar1);
  generate_index(this);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&pname);
  return;
}

Assistant:

void t_markdown_generator::generate_program() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  string pname = program_->get_name();
  current_file_ = make_file_name(pname);
  string fname = get_out_dir() + current_file_;
  f_out_.open(fname.c_str());
  f_out_ << "# Thrift module: " << pname << endl << endl;

  print_doc(program_);
  f_out_ << endl << endl;

  generate_program_toc();

  if (!program_->get_consts().empty()) {
    f_out_ << "***" << endl << "## Constants" << endl << endl;
    vector<t_const*> consts = program_->get_consts();
    f_out_ << "|Constant|Type|Value||" << endl
           << "|---|---|---|---|" << endl;
    generate_consts(consts);
    f_out_ << endl;
  }

  if (!program_->get_enums().empty()) {
    f_out_ << "***" << endl << "## Enumerations" << endl << endl;
    // Generate enums
    vector<t_enum*> enums = program_->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      generate_enum(*en_iter);
    }
  }

  if (!program_->get_typedefs().empty()) {
    f_out_ << "***" << endl << "## Type declarations" << endl << endl;
    // Generate typedefs
    vector<t_typedef*> typedefs = program_->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      generate_typedef(*td_iter);
    }
  }

  if (!program_->get_objects().empty()) {
    f_out_ << "***" << endl << "## Data structures" << endl << endl;
    // Generate structs and exceptions in declared order
    vector<t_struct*> objects = program_->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      if ((*o_iter)->is_xception()) {
        generate_xception(*o_iter);
      } else {
        generate_struct(*o_iter);
      }
    }
  }

  if (!program_->get_services().empty()) {
    f_out_ << "***" << endl << "## Services" << endl << endl;
    // Generate services
    vector<t_service*> services = program_->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      service_name_ = get_service_name(*sv_iter);
      generate_service(*sv_iter);
    }
  }

  f_out_ << endl;
  f_out_.close();

  generate_index();
}